

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O0

void __thiscall primesieve::iterator::skipto(iterator *this,uint64_t start,uint64_t stop_hint)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  in_RDI[5] = in_RSI;
  in_RDI[6] = in_RSI;
  in_RDI[7] = in_RDX;
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[8] = 0;
  anon_unknown.dwarf_f1942::clear<primesieve::PrimeGenerator>
            ((unique_ptr<primesieve::PrimeGenerator,_std::default_delete<primesieve::PrimeGenerator>_>
              *)0x151618);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x151626);
  return;
}

Assistant:

void iterator::skipto(uint64_t start,
                      uint64_t stop_hint)
{
  start_ = start;
  stop_ = start;
  stop_hint_ = stop_hint;
  i_ = 0;
  last_idx_ = 0;
  dist_ = 0;
  clear(primeGenerator_);
  primes_.clear();
}